

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

void __thiscall
TPZFMatrix<float>::TPZFMatrix
          (TPZFMatrix<float> *this,void **vtt,int64_t rows,int64_t cols,float *val)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (float *)0x0;
  this->fGiven = (float *)0x0;
  this->fSize = 0;
  TPZVec<int>::TPZVec(&(this->fPivot).super_TPZVec<int>,0);
  (this->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  (this->fPivot).super_TPZVec<int>.fStore = (this->fPivot).fExtAlloc;
  (this->fPivot).super_TPZVec<int>.fNElements = 0;
  (this->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  (this->fWork).fStore = (float *)0x0;
  (this->fWork).fNElements = 0;
  (this->fWork).fNAlloc = 0;
  uVar5 = cols * rows;
  if (uVar5 != 0) {
    pfVar3 = (float *)operator_new__(-(ulong)(uVar5 >> 0x3e != 0) | uVar5 * 4);
    this->fElem = pfVar3;
    auVar2 = _DAT_014d28c0;
    if (0 < (long)uVar5) {
      fVar1 = *val;
      lVar6 = uVar5 - 1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      uVar4 = 0;
      auVar7 = auVar7 ^ _DAT_014d28c0;
      auVar9 = _DAT_014d2b10;
      auVar10 = _DAT_014d28b0;
      do {
        auVar11 = auVar10 ^ auVar2;
        iVar8 = auVar7._4_4_;
        if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_
                    ) & 1)) {
          pfVar3[uVar4] = fVar1;
        }
        if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
            auVar11._12_4_ <= auVar7._12_4_) {
          pfVar3[uVar4 + 1] = fVar1;
        }
        auVar11 = auVar9 ^ auVar2;
        iVar12 = auVar11._4_4_;
        if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
          pfVar3[uVar4 + 2] = fVar1;
          pfVar3[uVar4 + 3] = fVar1;
        }
        uVar4 = uVar4 + 4;
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 4;
        auVar10._8_8_ = lVar6 + 4;
        lVar6 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 4;
        auVar9._8_8_ = lVar6 + 4;
      } while ((uVar5 + 3 & 0xfffffffffffffffc) != uVar4);
    }
  }
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const int64_t rows,const int64_t cols,const TVar & val )
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId), TPZMatrix<TVar>( rows, cols ), 
 fElem(0), fGiven(0), fSize(0) {
    int64_t size = rows * cols;
    if(!size) return;
    fElem=new TVar[size];
#ifdef PZDEBUG
    if ( fElem == NULL && size) Error( "Constructor <memory allocation error>." );
#endif
    for(int64_t i=0;i<size;i++) fElem[i] = val;
}